

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cdev.cpp
# Opt level: O0

int8_t __thiscall
I2Cdev::readBitsW(I2Cdev *this,uint16_t regAddr,uint8_t bitStart,uint8_t length,uint16_t *data,
                 uint16_t timeout)

{
  uint uVar1;
  ushort local_26 [2];
  uint16_t local_22;
  uint16_t mask;
  uint16_t w;
  uint8_t count;
  uint16_t timeout_local;
  uint16_t *data_local;
  uint8_t length_local;
  uint8_t bitStart_local;
  I2Cdev *pIStack_10;
  uint16_t regAddr_local;
  I2Cdev *this_local;
  
  local_22 = timeout;
  _mask = data;
  data_local._4_1_ = length;
  data_local._5_1_ = bitStart;
  data_local._6_2_ = regAddr;
  pIStack_10 = this;
  uVar1 = (*(this->super_I2Cgeneric)._vptr_I2Cgeneric[0x11])
                    (this,(ulong)regAddr,local_26,(ulong)timeout);
  if ((uVar1 & 0xff) != 0) {
    *_mask = (uint16_t)
             ((int)(uint)(local_26[0] &
                         (ushort)((1 << (data_local._4_1_ & 0x1f)) + -1 <<
                                 ((data_local._5_1_ - data_local._4_1_) + 1 & 0x1f))) >>
             ((data_local._5_1_ - data_local._4_1_) + 1 & 0x1f));
  }
  return (int8_t)uVar1;
}

Assistant:

int8_t I2Cdev::readBitsW(uint16_t regAddr, uint8_t bitStart, uint8_t length, uint16_t *data, uint16_t timeout) {
    // 1101011001101001 read byte
    // fedcba9876543210 bit numbers
    //    xxx           args: bitStart=12, length=3
    //    010           masked
    //           -> 010 shifted
    uint8_t count;
    uint16_t w;
    if ((count = this->readWord(regAddr, &w, timeout)) != 0) {
        uint16_t mask = ((1 << length) - 1) << (bitStart - length + 1);
        w &= mask;
        w >>= (bitStart - length + 1);
        *data = w;
    }
    return count;
}